

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cc
# Opt level: O0

int __thiscall Typelib::Registry::remove(Registry *this,char *__filename)

{
  bool bVar1;
  pointer ppVar2;
  size_type sVar3;
  _Self _Var4;
  Type *in_RDX;
  _Self local_68;
  iterator current_end;
  iterator current_it;
  _Self local_38;
  iterator global_end;
  iterator global_it;
  Type *type_local;
  Registry *this_local;
  set<Typelib::Type_*,_std::less<Typelib::Type_*>,_std::allocator<Typelib::Type_*>_> *types;
  
  reverseDepends((set<Typelib::Type_*,_std::less<Typelib::Type_*>,_std::allocator<Typelib::Type_*>_>
                  *)this,(Registry *)__filename,in_RDX);
  global_end = std::
               map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::Registry::RegistryType,_bool_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::Registry::RegistryType>_>_>
               ::begin((map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::Registry::RegistryType,_bool_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::Registry::RegistryType>_>_>
                        *)__filename);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::Registry::RegistryType,_bool_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::Registry::RegistryType>_>_>
       ::end((map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::Registry::RegistryType,_bool_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::Registry::RegistryType>_>_>
              *)__filename);
  while (bVar1 = std::operator!=(&global_end,&local_38), bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::Registry::RegistryType>_>
             ::operator->(&global_end);
    sVar3 = std::set<Typelib::Type_*,_std::less<Typelib::Type_*>,_std::allocator<Typelib::Type_*>_>
            ::count((set<Typelib::Type_*,_std::less<Typelib::Type_*>,_std::allocator<Typelib::Type_*>_>
                     *)this,&(ppVar2->second).type);
    if (sVar3 == 0) {
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::Registry::RegistryType>_>
      ::operator++(&global_end);
    }
    else {
      _Var4 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::Registry::RegistryType>_>
              ::operator++(&global_end,0);
      std::
      map<std::__cxx11::string_const,Typelib::Registry::RegistryType,bool(*)(std::__cxx11::string_const&,std::__cxx11::string_const&),std::allocator<std::pair<std::__cxx11::string_const,Typelib::Registry::RegistryType>>>
      ::erase_abi_cxx11_((map<std::__cxx11::string_const,Typelib::Registry::RegistryType,bool(*)(std::__cxx11::string_const&,std::__cxx11::string_const&),std::allocator<std::pair<std::__cxx11::string_const,Typelib::Registry::RegistryType>>>
                          *)__filename,(iterator)_Var4._M_node);
    }
  }
  current_end = std::
                map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::Registry::RegistryType,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::Registry::RegistryType>_>_>
                ::begin((map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::Registry::RegistryType,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::Registry::RegistryType>_>_>
                         *)(__filename + 0x30));
  local_68._M_node =
       (_Base_ptr)
       std::
       map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::Registry::RegistryType,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::Registry::RegistryType>_>_>
       ::end((map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::Registry::RegistryType,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::Registry::RegistryType>_>_>
              *)(__filename + 0x30));
  while (bVar1 = std::operator!=(&current_end,&local_68), bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::Registry::RegistryType>_>
             ::operator->(&current_end);
    sVar3 = std::set<Typelib::Type_*,_std::less<Typelib::Type_*>,_std::allocator<Typelib::Type_*>_>
            ::count((set<Typelib::Type_*,_std::less<Typelib::Type_*>,_std::allocator<Typelib::Type_*>_>
                     *)this,&(ppVar2->second).type);
    if (sVar3 == 0) {
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::Registry::RegistryType>_>
      ::operator++(&current_end);
    }
    else {
      _Var4 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Typelib::Registry::RegistryType>_>
              ::operator++(&current_end,0);
      std::
      map<std::__cxx11::string_const,Typelib::Registry::RegistryType,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,Typelib::Registry::RegistryType>>>
      ::erase_abi_cxx11_((map<std::__cxx11::string_const,Typelib::Registry::RegistryType,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,Typelib::Registry::RegistryType>>>
                          *)(__filename + 0x30),(iterator)_Var4._M_node);
    }
  }
  return (int)this;
}

Assistant:

std::set<Type *> Registry::remove(Type const& type)
    {
        std::set<Type*> types = reverseDepends(type);

        TypeMap::iterator global_it = m_global.begin(), global_end = m_global.end();
        while (global_it != global_end)
        {
            if (types.count(global_it->second.type))
                m_global.erase(global_it++);
            else ++global_it;
        }

        NameMap::iterator current_it = m_current.begin(), current_end = m_current.end();
        while (current_it != current_end)
        {
            if (types.count(current_it->second.type))
                m_current.erase(current_it++);
            else ++current_it;
        }

        return types;
    }